

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationShaderInputOutputTests.cpp
# Opt level: O3

TestStatus *
vkt::tessellation::anon_unknown_1::PerPatchData::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDefinition *caseDef)

{
  undefined1 auVar1 [16];
  pointer pfVar2;
  ulong uVar3;
  pointer pfVar4;
  int y;
  int y_00;
  size_type __n;
  int x;
  int x_00;
  int numPrimitives;
  long lVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vector<float,_std::allocator<float>_> vertexData;
  TextureLevel referenceImage;
  PixelBufferAccess access;
  Vec4 local_48;
  
  bVar6 = CASETYPE_PRIMITIVE_ID_TES < caseDef->caseType;
  lVar5 = 8;
  if (bVar6) {
    lVar5 = 1;
  }
  __n = 0x50;
  if (bVar6) {
    __n = 10;
  }
  access.super_ConstPixelBufferAccess.m_format =
       (TextureFormat)((ulong)access.super_ConstPixelBufferAccess.m_format & 0xffffffff00000000);
  std::vector<float,_std::allocator<float>_>::vector
            (&vertexData,__n,(value_type_conflict3 *)&access,(allocator_type *)&referenceImage);
  pfVar2 = vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar1 = _DAT_00ac4b80;
  numPrimitives = (int)lVar5;
  lVar5 = lVar5 + -1;
  auVar7._8_4_ = (int)lVar5;
  auVar7._0_8_ = lVar5;
  auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
  uVar3 = 0;
  auVar7 = auVar7 ^ _DAT_00ac4b80;
  pfVar4 = vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar8 = _DAT_00ac4b30;
  do {
    auVar9 = auVar8 ^ auVar1;
    if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                auVar7._4_4_ < auVar9._4_4_) & 1)) {
      *pfVar4 = (float)(int)uVar3 / (float)numPrimitives;
    }
    if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
        auVar9._12_4_ <= auVar7._12_4_) {
      pfVar4[10] = (float)((int)uVar3 + 1) / (float)numPrimitives;
    }
    uVar3 = uVar3 + 2;
    lVar5 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 2;
    auVar8._8_8_ = lVar5 + 2;
    pfVar4 = pfVar4 + 0x14;
  } while ((numPrimitives + 1U & 0xfffffffa) != uVar3);
  tcu::TextureLevel::TextureLevel(&referenceImage);
  if (caseDef->usesReferenceImageFromFile == true) {
    tcu::ImageIO::loadPNG
              (&referenceImage,context->m_testCtx->m_curArchive,
               (caseDef->referenceImagePath)._M_dataplus._M_p);
  }
  else {
    access.super_ConstPixelBufferAccess.m_format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::TextureLevel::setStorage(&referenceImage,(TextureFormat *)&access,0x100,0x100,1);
    tcu::TextureLevel::getAccess(&access,&referenceImage);
    local_48.m_data[0] = 1.0;
    local_48.m_data[1] = 1.0;
    local_48.m_data[2] = 1.0;
    local_48.m_data[3] = 1.0;
    y_00 = 0;
    do {
      x_00 = 0;
      do {
        tcu::PixelBufferAccess::setPixel(&access,&local_48,x_00,y_00,0);
        x_00 = x_00 + 1;
      } while (x_00 != 0x100);
      y_00 = y_00 + 1;
    } while (y_00 != 0x100);
  }
  pfVar4 = vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&access.super_ConstPixelBufferAccess,&referenceImage);
  runTest(__return_storage_ptr__,context,numPrimitives,10,5,VK_FORMAT_R32_SFLOAT,pfVar4,
          (long)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar2,
          &access.super_ConstPixelBufferAccess);
  tcu::TextureLevel::~TextureLevel(&referenceImage);
  if (vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	DE_ASSERT(!caseDef.usesReferenceImageFromFile || !caseDef.referenceImagePath.empty());

	// Input vertex attribute data
	const int		   numPrimitives	= getNumPrimitives(caseDef.caseType);
	std::vector<float> vertexData		(INPUT_PATCH_SIZE * numPrimitives, 0.0f);
	const VkDeviceSize vertexBufferSize = sizeof(float) * vertexData.size();

	for (int i = 0; i < numPrimitives; ++i)
		vertexData[INPUT_PATCH_SIZE * i] = static_cast<float>(i) / static_cast<float>(numPrimitives);

	tcu::TextureLevel referenceImage;
	if (caseDef.usesReferenceImageFromFile)
		tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), caseDef.referenceImagePath.c_str());
	else
		initializeWhiteReferenceImage(referenceImage, RENDER_SIZE, RENDER_SIZE);

	return runTest(context, numPrimitives, INPUT_PATCH_SIZE, OUTPUT_PATCH_SIZE,
				   VK_FORMAT_R32_SFLOAT, &vertexData[0], vertexBufferSize, referenceImage.getAccess());
}